

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puthread-posix.c
# Opt level: O1

void p_uthread_set_local(PUThreadKey *key,ppointer value)

{
  int iVar1;
  pthread_key_t *ppVar2;
  
  if (key != (PUThreadKey *)0x0) {
    ppVar2 = pp_uthread_get_tls_key(key);
    if (ppVar2 != (pthread_key_t *)0x0) {
      iVar1 = pthread_setspecific(*ppVar2,value);
      if (iVar1 != 0) {
        printf("** Error: %s **\n","PUThread::p_uthread_set_local: pthread_setspecific() failed");
        return;
      }
    }
  }
  return;
}

Assistant:

P_LIB_API void
p_uthread_set_local (PUThreadKey	*key,
		     ppointer		value)
{
	pthread_key_t *tls_key;

	if (P_UNLIKELY (key == NULL))
		return;

	tls_key = pp_uthread_get_tls_key (key);

	if (P_LIKELY (tls_key != NULL)) {
		if (P_UNLIKELY (pthread_setspecific (*tls_key, value) != 0))
			P_ERROR ("PUThread::p_uthread_set_local: pthread_setspecific() failed");
	}
}